

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O2

UBool __thiscall
icu_63::NFRuleSet::parse
          (NFRuleSet *this,UnicodeString *text,ParsePosition *pos,double upperBound,
          uint32_t nonNumericalExecutedRuleMask,Formattable *result)

{
  short sVar1;
  UBool UVar2;
  int64_t iVar3;
  int iVar4;
  int i;
  long lVar5;
  ulong uVar6;
  ParsePosition local_d8;
  ParsePosition *local_c8;
  ParsePosition local_c0;
  double local_b0;
  Formattable *local_a8;
  Formattable tempResult;
  
  UVar2 = '\0';
  local_c8 = pos;
  local_b0 = upperBound;
  local_a8 = result;
  Formattable::setLong(result,0);
  sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar4 = (text->fUnion).fFields.fLength;
  }
  else {
    iVar4 = (int)sVar1 >> 5;
  }
  if (iVar4 != 0) {
    local_c0.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003cffd0;
    local_c0.index = 0;
    local_c0.errorIndex = -1;
    local_d8.super_UObject._vptr_UObject = (_func_int **)&PTR__ParsePosition_003cffd0;
    local_d8.index = local_c8->index;
    local_d8.errorIndex = local_c8->errorIndex;
    for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
      if (this->nonNumericalRules[lVar5] != (NFRule *)0x0) {
        if ((nonNumericalExecutedRuleMask >> ((uint)lVar5 & 0x1f) & 1) == 0) {
          Formattable::Formattable(&tempResult);
          nonNumericalExecutedRuleMask = nonNumericalExecutedRuleMask | 1 << ((byte)lVar5 & 0x1f);
          UVar2 = NFRule::doParse(this->nonNumericalRules[lVar5],text,&local_d8,'\0',local_b0,
                                  nonNumericalExecutedRuleMask,&tempResult);
          if ((UVar2 != '\0') && (local_c0.index < local_d8.index)) {
            Formattable::operator=(local_a8,&tempResult);
            local_c0.index = local_d8.index;
            local_c0.errorIndex = local_d8.errorIndex;
          }
          local_d8.index = local_c8->index;
          local_d8.errorIndex = local_c8->errorIndex;
          Formattable::~Formattable(&tempResult);
        }
      }
    }
    iVar3 = util64_fromDouble(local_b0);
    for (uVar6 = (ulong)(this->rules).fCount; 0 < (int)uVar6; uVar6 = uVar6 - 1) {
      sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar4 = (text->fUnion).fFields.fLength;
      }
      else {
        iVar4 = (int)sVar1 >> 5;
      }
      if (iVar4 <= local_c0.index) break;
      if ((this->fIsFractionRuleSet != '\0') || ((this->rules).fStuff[uVar6 - 1]->baseValue < iVar3)
         ) {
        Formattable::Formattable(&tempResult);
        UVar2 = NFRule::doParse((this->rules).fStuff[uVar6 - 1],text,&local_d8,
                                this->fIsFractionRuleSet,local_b0,nonNumericalExecutedRuleMask,
                                &tempResult);
        if ((UVar2 != '\0') && (local_c0.index < local_d8.index)) {
          Formattable::operator=(local_a8,&tempResult);
          local_c0.index = local_d8.index;
          local_c0.errorIndex = local_d8.errorIndex;
        }
        local_d8.index = local_c8->index;
        local_d8.errorIndex = local_c8->errorIndex;
        Formattable::~Formattable(&tempResult);
      }
    }
    local_c8->index = local_c0.index;
    local_c8->errorIndex = local_c0.errorIndex;
    ParsePosition::~ParsePosition(&local_d8);
    ParsePosition::~ParsePosition(&local_c0);
    UVar2 = '\x01';
  }
  return UVar2;
}

Assistant:

UBool
NFRuleSet::parse(const UnicodeString& text, ParsePosition& pos, double upperBound, uint32_t nonNumericalExecutedRuleMask, Formattable& result) const
{
    // try matching each rule in the rule set against the text being
    // parsed.  Whichever one matches the most characters is the one
    // that determines the value we return.

    result.setLong(0);

    // dump out if there's no text to parse
    if (text.length() == 0) {
        return 0;
    }

    ParsePosition highWaterMark;
    ParsePosition workingPos = pos;

#ifdef RBNF_DEBUG
    fprintf(stderr, "<nfrs> %x '", this);
    dumpUS(stderr, name);
    fprintf(stderr, "' text '");
    dumpUS(stderr, text);
    fprintf(stderr, "'\n");
    fprintf(stderr, "  parse negative: %d\n", this, negativeNumberRule != 0);
#endif
    // Try each of the negative rules, fraction rules, infinity rules and NaN rules
    for (int i = 0; i < NON_NUMERICAL_RULE_LENGTH; i++) {
        if (nonNumericalRules[i] && ((nonNumericalExecutedRuleMask >> i) & 1) == 0) {
            // Mark this rule as being executed so that we don't try to execute it again.
            nonNumericalExecutedRuleMask |= 1 << i;

            Formattable tempResult;
            UBool success = nonNumericalRules[i]->doParse(text, workingPos, 0, upperBound, nonNumericalExecutedRuleMask, tempResult);
            if (success && (workingPos.getIndex() > highWaterMark.getIndex())) {
                result = tempResult;
                highWaterMark = workingPos;
            }
            workingPos = pos;
        }
    }
#ifdef RBNF_DEBUG
    fprintf(stderr, "<nfrs> continue other with text '");
    dumpUS(stderr, text);
    fprintf(stderr, "' hwm: %d\n", highWaterMark.getIndex());
#endif

    // finally, go through the regular rules one at a time.  We start
    // at the end of the list because we want to try matching the most
    // sigificant rule first (this helps ensure that we parse
    // "five thousand three hundred six" as
    // "(five thousand) (three hundred) (six)" rather than
    // "((five thousand three) hundred) (six)").  Skip rules whose
    // base values are higher than the upper bound (again, this helps
    // limit ambiguity by making sure the rules that match a rule's
    // are less significant than the rule containing the substitutions)/
    {
        int64_t ub = util64_fromDouble(upperBound);
#ifdef RBNF_DEBUG
        {
            char ubstr[64];
            util64_toa(ub, ubstr, 64);
            char ubstrhex[64];
            util64_toa(ub, ubstrhex, 64, 16);
            fprintf(stderr, "ub: %g, i64: %s (%s)\n", upperBound, ubstr, ubstrhex);
        }
#endif
        for (int32_t i = rules.size(); --i >= 0 && highWaterMark.getIndex() < text.length();) {
            if ((!fIsFractionRuleSet) && (rules[i]->getBaseValue() >= ub)) {
                continue;
            }
            Formattable tempResult;
            UBool success = rules[i]->doParse(text, workingPos, fIsFractionRuleSet, upperBound, nonNumericalExecutedRuleMask, tempResult);
            if (success && workingPos.getIndex() > highWaterMark.getIndex()) {
                result = tempResult;
                highWaterMark = workingPos;
            }
            workingPos = pos;
        }
    }
#ifdef RBNF_DEBUG
    fprintf(stderr, "<nfrs> exit\n");
#endif
    // finally, update the parse postion we were passed to point to the
    // first character we didn't use, and return the result that
    // corresponds to that string of characters
    pos = highWaterMark;

    return 1;
}